

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetC.c
# Opt level: O2

int point_mul_two_id_tc26_gost_3410_2012_512_paramSetC
              (EC_GROUP *group,EC_POINT *r,BIGNUM *n,EC_POINT *q,BIGNUM *m,BN_CTX *ctx)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  BIGNUM *pBVar6;
  BIGNUM *pBVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  byte bVar11;
  pt_prj_t_conflict4 *ppVar12;
  uint64_t *puVar13;
  pt_aff_t_conflict4 *ppVar14;
  limb_t *plVar15;
  pt_prj_t_conflict4 *ppVar16;
  uint64_t *puVar17;
  uint uVar18;
  byte bVar19;
  pt_prj_t_conflict4 Q;
  uchar b_y [64];
  uchar b_x [64];
  uchar b_m [64];
  uchar b_n [64];
  pt_aff_t_conflict4 local_1948;
  int8_t bnaf [513];
  int8_t anaf [513];
  pt_prj_t_conflict4 local_1438 [16];
  
  bVar19 = 0;
  BN_CTX_start((BN_CTX *)ctx);
  pBVar6 = BN_CTX_get((BN_CTX *)ctx);
  pBVar7 = BN_CTX_get((BN_CTX *)ctx);
  iVar4 = 0;
  iVar5 = 0;
  if (((((pBVar7 != (BIGNUM *)0x0) &&
        (iVar3 = EC_POINT_get_affine_coordinates(group,q,pBVar6,pBVar7,ctx), iVar3 != 0)) &&
       (iVar3 = BN_bn2lebinpad(pBVar6,b_x,0x40), iVar5 = iVar4, iVar3 == 0x40)) &&
      ((iVar4 = BN_bn2lebinpad(pBVar7,b_y,0x40), iVar4 == 0x40 &&
       (iVar4 = BN_bn2lebinpad(n,b_n,0x40), iVar4 == 0x40)))) &&
     (iVar4 = BN_bn2lebinpad(m,b_m,0x40), iVar4 == 0x40)) {
    fiat_id_tc26_gost_3410_2012_512_paramSetC_from_bytes(local_1948.X,b_x);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_from_bytes(local_1948.Y,b_y);
    memset(anaf,0,0x201);
    memset(bnaf,0,0x201);
    memset(&Q,0,0x140);
    precomp_wnaf(local_1438,&local_1948);
    scalar_wnaf(anaf,b_n);
    scalar_wnaf(bnaf,b_m);
    bVar11 = 0;
    bVar2 = true;
    for (uVar18 = 0x200; -1 < (int)uVar18; uVar18 = uVar18 - 1) {
      if (!bVar2) {
        point_double(&Q,&Q);
      }
      bVar1 = bnaf[uVar18];
      if (bVar1 != 0) {
        if (bVar11 != bVar1 >> 7) {
          fiat_id_tc26_gost_3410_2012_512_paramSetC_opp(Q.X,Q.X);
          fiat_id_tc26_gost_3410_2012_512_paramSetC_opp(Q.T,Q.T);
          bVar11 = bVar11 ^ 1;
        }
        uVar8 = (int)((int)(char)bVar1 - 1U) >> 1;
        if ((char)bVar1 < '\0') {
          uVar8 = (uint)~(int)(char)bVar1 >> 1;
        }
        if (bVar2) {
          lVar10 = 10;
          ppVar12 = local_1438 + (int)uVar8;
          ppVar16 = &Q;
          for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
            ppVar16->X[0] = ppVar12->X[0];
            ppVar12 = (pt_prj_t_conflict4 *)((long)ppVar12 + (ulong)bVar19 * -0x10 + 8);
            ppVar16 = (pt_prj_t_conflict4 *)((long)ppVar16 + (ulong)bVar19 * -0x10 + 8);
          }
          puVar13 = local_1438[(int)uVar8].Y;
          puVar17 = Q.Y;
          for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
            *puVar17 = *puVar13;
            puVar13 = puVar13 + (ulong)bVar19 * -2 + 1;
            puVar17 = puVar17 + (ulong)bVar19 * -2 + 1;
          }
          puVar13 = local_1438[(int)uVar8].T;
          puVar17 = Q.T;
          for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
            *puVar17 = *puVar13;
            puVar13 = puVar13 + (ulong)bVar19 * -2 + 1;
            puVar17 = puVar17 + (ulong)bVar19 * -2 + 1;
          }
          puVar13 = local_1438[(int)uVar8].Z;
          puVar17 = Q.Z;
          for (; lVar10 != 0; lVar10 = lVar10 + -1) {
            *puVar17 = *puVar13;
            puVar13 = puVar13 + (ulong)bVar19 * -2 + 1;
            puVar17 = puVar17 + (ulong)bVar19 * -2 + 1;
          }
        }
        else {
          point_add_proj(&Q,&Q,local_1438 + (int)uVar8);
        }
        bVar2 = false;
      }
      bVar1 = anaf[uVar18];
      if (bVar1 != 0) {
        if (bVar11 != bVar1 >> 7) {
          fiat_id_tc26_gost_3410_2012_512_paramSetC_opp(Q.X,Q.X);
          fiat_id_tc26_gost_3410_2012_512_paramSetC_opp(Q.T,Q.T);
          bVar11 = bVar11 ^ 1;
        }
        uVar8 = (int)((int)(char)bVar1 - 1U) >> 1;
        if ((char)bVar1 < '\0') {
          uVar8 = (uint)~(int)(char)bVar1 >> 1;
        }
        if (bVar2) {
          lVar10 = 10;
          ppVar14 = lut_cmb[0] + (int)uVar8;
          ppVar12 = &Q;
          for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
            ppVar12->X[0] = ppVar14->X[0];
            ppVar14 = (pt_aff_t_conflict4 *)((long)ppVar14 + (ulong)bVar19 * -0x10 + 8);
            ppVar12 = (pt_prj_t_conflict4 *)((long)ppVar12 + (ulong)bVar19 * -0x10 + 8);
          }
          puVar13 = lut_cmb[0][(int)uVar8].Y;
          puVar17 = Q.Y;
          for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
            *puVar17 = *puVar13;
            puVar13 = puVar13 + (ulong)bVar19 * -2 + 1;
            puVar17 = puVar17 + (ulong)bVar19 * -2 + 1;
          }
          puVar13 = lut_cmb[0][(int)uVar8].T;
          puVar17 = Q.T;
          for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
            *puVar17 = *puVar13;
            puVar13 = puVar13 + (ulong)bVar19 * -2 + 1;
            puVar17 = puVar17 + (ulong)bVar19 * -2 + 1;
          }
          plVar15 = const_one;
          puVar13 = Q.Z;
          for (; lVar10 != 0; lVar10 = lVar10 + -1) {
            *puVar13 = *plVar15;
            plVar15 = plVar15 + (ulong)bVar19 * -2 + 1;
            puVar13 = puVar13 + (ulong)bVar19 * -2 + 1;
          }
        }
        else {
          point_add_mixed(&Q,&Q,lut_cmb[0] + (int)uVar8);
        }
        bVar2 = false;
      }
    }
    if (bVar2) {
      Q.X[8] = 0;
      Q.X[9] = 0;
      Q.X[6] = 0;
      Q.X[7] = 0;
      Q.X[4] = 0;
      Q.X[5] = 0;
      Q.X[2] = 0;
      Q.X[3] = 0;
      Q.X[0] = 0;
      Q.X[1] = 0;
      lVar10 = 10;
      plVar15 = const_one;
      puVar13 = Q.Y;
      for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
        *puVar13 = *plVar15;
        plVar15 = plVar15 + (ulong)bVar19 * -2 + 1;
        puVar13 = puVar13 + (ulong)bVar19 * -2 + 1;
      }
      Q.T[8] = 0;
      Q.T[9] = 0;
      Q.T[6] = 0;
      Q.T[7] = 0;
      Q.T[4] = 0;
      Q.T[5] = 0;
      Q.T[2] = 0;
      Q.T[3] = 0;
      Q.T[0] = 0;
      Q.T[1] = 0;
      plVar15 = const_one;
      puVar13 = Q.Z;
      for (; lVar10 != 0; lVar10 = lVar10 + -1) {
        *puVar13 = *plVar15;
        plVar15 = plVar15 + (ulong)bVar19 * -2 + 1;
        puVar13 = puVar13 + (ulong)bVar19 * -2 + 1;
      }
    }
    if (bVar11 != 0) {
      fiat_id_tc26_gost_3410_2012_512_paramSetC_opp(Q.X,Q.X);
      fiat_id_tc26_gost_3410_2012_512_paramSetC_opp(Q.T,Q.T);
    }
    point_edwards2legacy(&Q,&Q);
    puVar13 = Q.Z;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_inv(puVar13,puVar13);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(local_1948.X,Q.X,puVar13);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(local_1948.Y,Q.Y,puVar13);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_to_bytes(b_x,local_1948.X);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_to_bytes(b_y,local_1948.Y);
    iVar5 = CRYPTO_memcmp("",b_x,0x40);
    if ((iVar5 == 0) && (iVar5 = CRYPTO_memcmp("",b_y,0x40), iVar5 == 0)) {
      iVar5 = EC_POINT_set_to_infinity((EC_GROUP *)group,(EC_POINT *)r);
      if (iVar5 == 0) {
        iVar5 = 0;
        goto LAB_001359f8;
      }
    }
    else {
      lVar10 = BN_lebin2bn(b_x,0x40,pBVar6);
      iVar5 = 0;
      if ((lVar10 == 0) ||
         ((lVar10 = BN_lebin2bn(b_y,0x40,pBVar7), lVar10 == 0 ||
          (iVar4 = EC_POINT_set_affine_coordinates(group,r,pBVar6,pBVar7,ctx), iVar4 == 0))))
      goto LAB_001359f8;
    }
    iVar5 = 1;
  }
LAB_001359f8:
  BN_CTX_end((BN_CTX *)ctx);
  return iVar5;
}

Assistant:

int
    point_mul_two_id_tc26_gost_3410_2012_512_paramSetC(
        const EC_GROUP *group, EC_POINT *r, const BIGNUM *n, const EC_POINT *q,
        const BIGNUM *m, BN_CTX *ctx) {
    int ret = 0;
    unsigned char b_x[64];
    unsigned char b_y[64];
    unsigned char b_n[64];
    unsigned char b_m[64];
    BIGNUM *x = NULL, *y = NULL;

    BN_CTX_start(ctx);
    x = BN_CTX_get(ctx);
    if ((y = BN_CTX_get(ctx)) == NULL
        /* pull out coords as bytes */
        || !EC_POINT_get_affine_coordinates(group, q, x, y, ctx) ||
        BN_bn2lebinpad(x, b_x, 64) != 64 || BN_bn2lebinpad(y, b_y, 64) != 64 ||
        BN_bn2lebinpad(n, b_n, 64) != 64 || BN_bn2lebinpad(m, b_m, 64) != 64)
        goto err;
    /* do the simultaneous scalar multiplication */
    point_mul_two(b_x, b_y, b_n, b_m, b_x, b_y);
    /* check for infinity */
    if (CRYPTO_memcmp(const_zb, b_x, 64) == 0 &&
        CRYPTO_memcmp(const_zb, b_y, 64) == 0) {
        if (!EC_POINT_set_to_infinity(group, r)) goto err;
    } else {
        /* otherwise, pack the bytes into the result */
        if (BN_lebin2bn(b_x, 64, x) == NULL ||
            BN_lebin2bn(b_y, 64, y) == NULL ||
            !EC_POINT_set_affine_coordinates(group, r, x, y, ctx))
            goto err;
    }
    ret = 1;
err:
    BN_CTX_end(ctx);
    return ret;
}